

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O3

void __thiscall YAML::NodeBuilder::RegisterAnchor(NodeBuilder *this,anchor_t anchor,node *node)

{
  pointer *pppnVar1;
  iterator __position;
  node *local_8;
  
  if (anchor != 0) {
    __position._M_current =
         (this->m_anchors).
         super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_anchors).
        super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_8 = node;
      std::vector<YAML::detail::node*,std::allocator<YAML::detail::node*>>::
      _M_realloc_insert<YAML::detail::node*>
                ((vector<YAML::detail::node*,std::allocator<YAML::detail::node*>> *)&this->m_anchors
                 ,__position,&local_8);
    }
    else {
      *__position._M_current = node;
      pppnVar1 = &(this->m_anchors).
                  super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppnVar1 = *pppnVar1 + 1;
    }
  }
  return;
}

Assistant:

void NodeBuilder::RegisterAnchor(anchor_t anchor, detail::node& node) {
  if (anchor) {
    assert(anchor == m_anchors.size());
    m_anchors.push_back(&node);
  }
}